

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Identification::Dump(Identification *this,FILE *stream)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  undefined8 uVar4;
  UTF16String *this_00;
  char local_98 [8];
  char identbuf [128];
  FILE *stream_local;
  Identification *this_local;
  
  local_98[0] = '\0';
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,(FILE *)identbuf._120_8_);
  uVar1 = identbuf._120_8_;
  pcVar3 = Kumu::UUID::EncodeString(&this->ThisGenerationUID,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","ThisGenerationUID",pcVar3);
  uVar1 = identbuf._120_8_;
  pcVar3 = UTF16String::EncodeString(&this->CompanyName,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","CompanyName",pcVar3);
  uVar1 = identbuf._120_8_;
  pcVar3 = UTF16String::EncodeString(&this->ProductName,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","ProductName",pcVar3);
  uVar1 = identbuf._120_8_;
  pcVar3 = VersionType::EncodeString(&this->ProductVersion,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","ProductVersion",pcVar3);
  uVar1 = identbuf._120_8_;
  pcVar3 = UTF16String::EncodeString(&this->VersionString,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","VersionString",pcVar3);
  uVar1 = identbuf._120_8_;
  pcVar3 = Kumu::UUID::EncodeString(&this->ProductUID,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","ProductUID",pcVar3);
  uVar1 = identbuf._120_8_;
  uVar4 = Kumu::Timestamp::EncodeString((char *)&this->ModificationDate,(uint)local_98);
  fprintf((FILE *)uVar1,"  %22s = %s\n","ModificationDate",uVar4);
  uVar1 = identbuf._120_8_;
  pcVar3 = VersionType::EncodeString(&this->ToolkitVersion,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","ToolkitVersion",pcVar3);
  bVar2 = optional_property<ASDCP::MXF::UTF16String>::empty(&this->Platform);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    this_00 = optional_property<ASDCP::MXF::UTF16String>::get(&this->Platform);
    pcVar3 = UTF16String::EncodeString(this_00,local_98,0x80);
    fprintf((FILE *)uVar1,"  %22s = %s\n","Platform",pcVar3);
  }
  return;
}

Assistant:

void
Identification::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "ThisGenerationUID", ThisGenerationUID.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "CompanyName", CompanyName.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ProductName", ProductName.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ProductVersion", ProductVersion.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "VersionString", VersionString.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ProductUID", ProductUID.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ModificationDate", ModificationDate.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ToolkitVersion", ToolkitVersion.EncodeString(identbuf, IdentBufferLen));
  if ( ! Platform.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "Platform", Platform.get().EncodeString(identbuf, IdentBufferLen));
  }
}